

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# span.hpp
# Opt level: O3

void __thiscall
nonstd::span_lite::span<float_const,18446744073709551615ul>::span<float_const,4ul>
          (span<float_const,18446744073709551615ul> *this,span<const_float,_4UL> *other)

{
  size_type sVar1;
  logic_error *this_00;
  contract_violation local_20;
  
  *(pointer *)this = other->data_;
  sVar1 = other->size_;
  *(size_type *)(this + 8) = sVar1;
  if (sVar1 == 4) {
    return;
  }
  this_00 = (logic_error *)__cxa_allocate_exception(0x10);
  detail::contract_violation::contract_violation
            (&local_20,
             "/workspace/llm4binary/github/license_c_cmakelists/martinmoene[P]span-lite/include/nonstd/span.hpp:1147: Precondition violation."
            );
  std::logic_error::logic_error(this_00,&local_20.super_logic_error);
  *(undefined ***)this_00 = &PTR__logic_error_001b6c70;
  __cxa_throw(this_00,&detail::contract_violation::typeinfo,std::logic_error::~logic_error);
}

Assistant:

span_constexpr pointer data() const span_noexcept
    {
        return data_;
    }